

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O2

void m256v_LU_mult_inplace(m256v *LU,int *inv_rowperm,int *colperm,m256v *X_inout)

{
  m256v Y;
  m256v X;
  m256v local_48;
  m256v local_30;
  
  local_30.n_row = LU->n_col;
  local_48.n_col = X_inout->n_col;
  local_48.rstride = X_inout->rstride;
  local_48.e = X_inout->e;
  local_48.n_row = LU->n_row;
  local_30.n_col = local_48.n_col;
  local_30.rstride = local_48.rstride;
  local_30.e = local_48.e;
  if (colperm != (int *)0x0) {
    m256v_permute_rows(&local_30,colperm);
  }
  m256v_U_mult_inplace(LU,X_inout);
  m256v_L_mult_inplace(LU,X_inout);
  if (inv_rowperm != (int *)0x0) {
    m256v_permute_rows(&local_48,inv_rowperm);
  }
  return;
}

Assistant:

void MV_GEN_N(_LU_mult_inplace)(const MV_GEN_TYPE* LU,
		   const int* inv_rowperm,
		   const int* colperm,
		   MV_GEN_TYPE* X_inout)
{
	/* Create the views for inputs & outputs
	 *
	 * The views access the same underlying backend storage,
	 * so some elements alias.  The number of rows of the views
	 * differ, however.
	 */
	assert(LU->n_col <= X_inout->n_row);
	assert(LU->n_row <= X_inout->n_row);
	MV_GEN_TYPE X = MV_GEN_N(_get_subview)(X_inout, 0, 0, LU->n_col, X_inout->n_col);
	MV_GEN_TYPE Y = MV_GEN_N(_get_subview)(X_inout, 0, 0, LU->n_row, X_inout->n_col);

	/* Apply the column permutation */
	if (colperm != NULL) {
		MV_GEN_N(_permute_rows)(&X, colperm);
	}

	MV_GEN_N(_U_mult_inplace)(LU, X_inout);
	MV_GEN_N(_L_mult_inplace)(LU, X_inout);

	/* Apply the row permutation */
	if (inv_rowperm != NULL) {
		MV_GEN_N(_permute_rows)(&Y, inv_rowperm);
	}
}